

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O0

bool __thiscall
Assimp::EmbedTexturesProcess::addTexture(EmbedTexturesProcess *this,aiScene *pScene,string *path)

{
  uint uVar1;
  aiTexture **__src;
  undefined1 auVar2 [16];
  bool bVar3;
  _Ios_Openmode _Var4;
  Logger *pLVar5;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar6;
  basic_formatter *pbVar7;
  ulong uVar8;
  void *pvVar9;
  aiTexture **ppaVar10;
  aiTexture *this_00;
  streamoff sVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  char *__dest;
  char *__src_00;
  size_t local_6d0;
  size_t len;
  undefined1 local_6a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> extension;
  aiTexture *pTexture;
  aiTexture **oldTextures;
  uint textureId;
  aiTexel *imageContent;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  string local_4e8;
  fpos<__mbstate_t> local_4c8;
  undefined1 local_4b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  fpos<__mbstate_t> local_468;
  undefined1 local_458 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_2b0;
  fpos<__mbstate_t> local_290;
  undefined1 local_280 [16];
  string local_260 [8];
  ifstream file;
  undefined1 local_58 [8];
  string imagePath;
  streampos imageSize;
  string *path_local;
  aiScene *pScene_local;
  EmbedTexturesProcess *this_local;
  
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)((long)&imagePath.field_2 + 8),0);
  std::__cxx11::string::string((string *)local_58,(string *)path);
  _Var4 = std::operator|(_S_bin,_S_ate);
  std::ifstream::ifstream(local_260,(string *)local_58,_Var4);
  local_280 = std::istream::tellg();
  imagePath.field_2._8_8_ = local_280._0_8_;
  std::fpos<__mbstate_t>::fpos(&local_290,-1);
  bVar3 = std::operator==((fpos<__mbstate_t> *)((long)&imagePath.field_2 + 8),&local_290);
  if (bVar3) {
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[42]>(&local_428,(char (*) [42])"EmbedTexturesProcess: Cannot find image: ")
    ;
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_428,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58);
    pbVar7 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar6,(char (*) [38])". Will try to find it in root folder.");
    Formatter::basic_formatter::operator_cast_to_string(&local_2b0,pbVar7);
    Logger::warn(pLVar5,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_428);
    std::operator+(&local_448,&this->mRootPath,path);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::operator|(_S_bin,_S_ate);
    std::ifstream::open(local_260,(_Ios_Openmode)local_58);
    local_458 = std::istream::tellg();
    imagePath.field_2._8_8_ = local_458._0_8_;
    std::fpos<__mbstate_t>::fpos(&local_468,-1);
    bVar3 = std::operator==((fpos<__mbstate_t> *)((long)&imagePath.field_2 + 8),&local_468);
    if (bVar3) {
      std::__cxx11::string::find_last_of((char *)path,0x2bded0);
      std::__cxx11::string::substr((ulong)&local_4a8,(ulong)path);
      std::operator+(&local_488,&this->mRootPath,&local_4a8);
      std::__cxx11::string::operator=((string *)local_58,(string *)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::operator|(_S_bin,_S_ate);
      std::ifstream::open(local_260,(_Ios_Openmode)local_58);
      local_4b8 = std::istream::tellg();
      imagePath.field_2._8_8_ = local_4b8._0_8_;
      std::fpos<__mbstate_t>::fpos(&local_4c8,-1);
      bVar3 = std::operator==((fpos<__mbstate_t> *)((long)&imagePath.field_2 + 8),&local_4c8);
      if (bVar3) {
        pLVar5 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[48]>
                  (&local_660,(char (*) [48])"EmbedTexturesProcess: Unable to embed texture: ");
        pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &local_660,path);
        pbVar7 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar6,(char (*) [2])0x2ba179);
        Formatter::basic_formatter::operator_cast_to_string(&local_4e8,pbVar7);
        Logger::error(pLVar5,&local_4e8);
        std::__cxx11::string::~string((string *)&local_4e8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_660);
        this_local._7_1_ = false;
        goto LAB_00189d4e;
      }
    }
  }
  uVar8 = std::fpos::operator_cast_to_long((fpos *)(imagePath.field_2._M_local_buf + 8));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (uVar8 >> 2) + 1;
  uVar8 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar8);
  std::istream::seekg((long)local_260,_S_beg);
  std::fpos::operator_cast_to_long((fpos *)(imagePath.field_2._M_local_buf + 8));
  std::istream::read((char *)local_260,(long)pvVar9);
  uVar1 = pScene->mNumTextures;
  pScene->mNumTextures = uVar1 + 1;
  __src = pScene->mTextures;
  ppaVar10 = (aiTexture **)operator_new__((ulong)pScene->mNumTextures << 3);
  pScene->mTextures = ppaVar10;
  memmove(pScene->mTextures,__src,(ulong)(pScene->mNumTextures - 1) << 3);
  this_00 = (aiTexture *)operator_new(0x428);
  aiTexture::aiTexture(this_00);
  this_00->mHeight = 0;
  extension.field_2._8_8_ = this_00;
  sVar11 = std::fpos::operator_cast_to_long((fpos *)(imagePath.field_2._M_local_buf + 8));
  *(int *)extension.field_2._8_8_ = (int)sVar11;
  *(void **)(extension.field_2._8_8_ + 0x18) = pvVar9;
  std::__cxx11::string::find_last_of((char)path,0x2e);
  std::__cxx11::string::substr((ulong)local_6a8,(ulong)path);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
            (__first,__last,__result,tolower);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6a8,"jpeg");
  if (bVar3) {
    std::__cxx11::string::operator=((string *)local_6a8,"jpg");
  }
  local_6d0 = std::__cxx11::string::size();
  if (8 < local_6d0) {
    local_6d0 = 8;
  }
  __dest = (char *)(extension.field_2._8_8_ + 8);
  __src_00 = (char *)std::__cxx11::string::c_str();
  strncpy(__dest,__src_00,local_6d0);
  pScene->mTextures[uVar1] = (aiTexture *)extension.field_2._8_8_;
  this_local._7_1_ = true;
  std::__cxx11::string::~string((string *)local_6a8);
LAB_00189d4e:
  std::ifstream::~ifstream(local_260);
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool EmbedTexturesProcess::addTexture(aiScene* pScene, std::string path) const {
    std::streampos imageSize = 0;
    std::string    imagePath = path;

    // Test path directly
    std::ifstream file(imagePath, std::ios::binary | std::ios::ate);
    if ((imageSize = file.tellg()) == std::streampos(-1)) {
        ASSIMP_LOG_WARN_F("EmbedTexturesProcess: Cannot find image: ", imagePath, ". Will try to find it in root folder.");

        // Test path in root path
        imagePath = mRootPath + path;
        file.open(imagePath, std::ios::binary | std::ios::ate);
        if ((imageSize = file.tellg()) == std::streampos(-1)) {
            // Test path basename in root path
            imagePath = mRootPath + path.substr(path.find_last_of("\\/") + 1u);
            file.open(imagePath, std::ios::binary | std::ios::ate);
            if ((imageSize = file.tellg()) == std::streampos(-1)) {
                ASSIMP_LOG_ERROR_F("EmbedTexturesProcess: Unable to embed texture: ", path, ".");
                return false;
            }
        }
    }

    aiTexel* imageContent = new aiTexel[ 1ul + static_cast<unsigned long>( imageSize ) / sizeof(aiTexel)];
    file.seekg(0, std::ios::beg);
    file.read(reinterpret_cast<char*>(imageContent), imageSize);

    // Enlarging the textures table
    unsigned int textureId = pScene->mNumTextures++;
    auto oldTextures = pScene->mTextures;
    pScene->mTextures = new aiTexture*[pScene->mNumTextures];
    ::memmove(pScene->mTextures, oldTextures, sizeof(aiTexture*) * (pScene->mNumTextures - 1u));

    // Add the new texture
    auto pTexture = new aiTexture;
    pTexture->mHeight = 0; // Means that this is still compressed
    pTexture->mWidth = static_cast<uint32_t>(imageSize);
    pTexture->pcData = imageContent;

    auto extension = path.substr(path.find_last_of('.') + 1u);
    std::transform(extension.begin(), extension.end(), extension.begin(), ::tolower);
    if (extension == "jpeg") {
        extension = "jpg";
    }

    size_t len = extension.size();
    if (len > HINTMAXTEXTURELEN -1 ) {
        len = HINTMAXTEXTURELEN - 1;
    }
    ::strncpy(pTexture->achFormatHint, extension.c_str(), len);
    pScene->mTextures[textureId] = pTexture;

    return true;
}